

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests.c
# Opt level: O3

void test_ecmult_constants_sha(uint32_t prefix,size_t iter,uchar *expected32)

{
  int iVar1;
  secp256k1_scratch *scratch;
  long lVar2;
  ulong uVar3;
  code *pcVar4;
  secp256k1_scalar *psVar5;
  secp256k1_strauss_point_state *psVar6;
  secp256k1_strauss_point_state *scratch_00;
  size_t sVar7;
  secp256k1_gej *r;
  ulong uVar8;
  uchar *out32;
  secp256k1_strauss_point_state *scratch_01;
  secp256k1_sha256 *hash;
  secp256k1_strauss_point_state *elem;
  code *cb;
  secp256k1_strauss_point_state *cbdata;
  secp256k1_sha256 *acc;
  secp256k1_callback *error_callback;
  ulong uVar9;
  size_t sVar10;
  secp256k1_strauss_point_state *r_00;
  uchar inp [6];
  uchar b32 [32];
  ulong uStack_1598;
  secp256k1_strauss_state sStack_1590;
  secp256k1_fe asStack_1578 [8];
  secp256k1_strauss_point_state sStack_1438;
  secp256k1_ge asStack_1028 [8];
  secp256k1_callback *psStack_d58;
  secp256k1_gej *psStack_d50;
  secp256k1_strauss_point_state *psStack_d48;
  secp256k1_strauss_point_state *psStack_d40;
  secp256k1_strauss_point_state *psStack_d38;
  size_t sStack_d28;
  undefined1 auStack_d10 [8];
  undefined1 auStack_d08 [88];
  secp256k1_gej sStack_cb0;
  secp256k1_gej sStack_c30;
  secp256k1_gej sStack_bb0;
  secp256k1_gej sStack_b30;
  secp256k1_gej asStack_ab0 [2];
  secp256k1_strauss_point_state sStack_970;
  secp256k1_gej sStack_560;
  secp256k1_gej sStack_4e0;
  undefined1 auStack_460 [720];
  secp256k1_sha256 *psStack_190;
  undefined1 *puStack_188;
  size_t sStack_180;
  size_t sStack_178;
  code *apcStack_170 [2];
  uint32_t local_15e;
  undefined2 local_15a;
  size_t local_158;
  uchar *local_150;
  undefined1 local_148 [40];
  int aiStack_120 [6];
  secp256k1_sha256 local_108;
  secp256k1_sha256 local_98;
  
  out32 = (uchar *)(ulong)prefix;
  apcStack_170[0] = (code *)0x16928b;
  local_158 = iter;
  local_150 = expected32;
  scratch = secp256k1_scratch_create(&CTX->error_callback,0x10000);
  acc = &local_98;
  local_98.s[0] = 0x6a09e667;
  local_98.s[1] = 0xbb67ae85;
  local_98.s[2] = 0x3c6ef372;
  local_98.s[3] = 0xa54ff53a;
  local_98.s[4] = 0x510e527f;
  local_98.s[5] = 0x9b05688c;
  local_98.s[6] = 0x1f83d9ab;
  local_98.s[7] = 0x5be0cd19;
  sVar10 = 0;
  local_98.bytes = 0;
  psVar5 = (secp256k1_scalar *)(local_148 + 0x20);
  local_148._32_4_ = 0;
  local_148._36_4_ = 0;
  aiStack_120[0] = 0;
  aiStack_120[1] = 0;
  aiStack_120[2] = 0;
  aiStack_120[3] = 0;
  aiStack_120[4] = 0;
  aiStack_120[5] = 0;
  apcStack_170[0] = (code *)0x1692db;
  local_15e = prefix;
  test_ecmult_accumulate(acc,psVar5,scratch);
  local_148._32_4_ = 1;
  local_148._36_4_ = 0;
  aiStack_120[0] = 0;
  aiStack_120[1] = 0;
  aiStack_120[2] = 0;
  aiStack_120[3] = 0;
  aiStack_120[4] = 0;
  aiStack_120[5] = 0;
  apcStack_170[0] = (code *)0x1692fd;
  test_ecmult_accumulate(acc,psVar5,scratch);
  apcStack_170[0] = (code *)0x169308;
  secp256k1_scalar_negate(psVar5,psVar5);
  apcStack_170[0] = (code *)0x169319;
  test_ecmult_accumulate(acc,psVar5,scratch);
  sVar7 = local_158;
  if (local_158 != 0) {
    sVar10 = 0;
    acc = &local_108;
    out32 = local_148;
    do {
      local_15a = (undefined2)sVar10;
      local_108.s[0] = 0x6a09e667;
      local_108.s[1] = 0xbb67ae85;
      local_108.s[2] = 0x3c6ef372;
      local_108.s[3] = 0xa54ff53a;
      local_108.s[4] = 0x510e527f;
      local_108.s[5] = 0x9b05688c;
      local_108.s[6] = 0x1f83d9ab;
      local_108.s[7] = 0x5be0cd19;
      local_108.bytes = 0;
      apcStack_170[0] = (code *)0x169375;
      secp256k1_sha256_write(acc,(uchar *)&local_15e,6);
      apcStack_170[0] = (code *)0x169380;
      secp256k1_sha256_finalize(acc,out32);
      apcStack_170[0] = (code *)0x16938d;
      secp256k1_scalar_set_b32((secp256k1_scalar *)(local_148 + 0x20),out32,(int *)0x0);
      apcStack_170[0] = (code *)0x1693a0;
      test_ecmult_accumulate(&local_98,(secp256k1_scalar *)(local_148 + 0x20),scratch);
      sVar10 = sVar10 + 1;
    } while (sVar7 != sVar10);
  }
  hash = &local_98;
  psVar6 = (secp256k1_strauss_point_state *)local_148;
  apcStack_170[0] = (code *)0x1693ba;
  secp256k1_sha256_finalize(hash,(uchar *)psVar6);
  lVar2 = 0;
  while (local_148[lVar2] == local_150[lVar2]) {
    lVar2 = lVar2 + 1;
    if (lVar2 == 0x20) {
      apcStack_170[0] = (code *)0x1693e7;
      secp256k1_scratch_destroy(&CTX->error_callback,scratch);
      return;
    }
  }
  apcStack_170[0] = test_ecmult_accumulate;
  test_ecmult_constants_sha_cold_1();
  sStack_178 = sVar7;
  auStack_d10 = (undefined1  [8])0x41;
  sStack_4e0.infinity = 0;
  sStack_4e0.x.n[0] = 0x2815b16f81798;
  sStack_4e0.x.n[1] = 0xdb2dce28d959f;
  sStack_4e0.x.n[2] = 0xe870b07029bfc;
  sStack_4e0.x.n[3] = 0xbbac55a06295c;
  sStack_4e0.x.n[4] = 0x79be667ef9dc;
  sStack_4e0.y.n[4] = 0x483ada7726a3;
  sStack_4e0.y.n[0] = 0x7d08ffb10d4b8;
  sStack_4e0.y.n[1] = 0x48a68554199c4;
  sStack_4e0.y.n[2] = 0xe1108a8fd17b4;
  sStack_4e0.y.n[3] = 0xc4655da4fbfc0;
  sStack_4e0.z.n[0] = 1;
  sStack_4e0.z.n[1] = 0;
  sStack_4e0.z.n[2] = 0;
  sStack_4e0.z.n[3] = 0;
  sStack_4e0.z.n[4] = 0;
  sStack_560.infinity = 1;
  sStack_560.z.n[4] = 0;
  sStack_560.z.n[2] = 0;
  sStack_560.z.n[3] = 0;
  sStack_560.z.n[0] = 0;
  sStack_560.z.n[1] = 0;
  sStack_560.y.n[3] = 0;
  sStack_560.y.n[4] = 0;
  sStack_560.y.n[1] = 0;
  sStack_560.y.n[2] = 0;
  sStack_560.x.n[4] = 0;
  sStack_560.y.n[0] = 0;
  sStack_560.x.n[2] = 0;
  sStack_560.x.n[3] = 0;
  sStack_560.x.n[0] = 0;
  sStack_560.x.n[1] = 0;
  psStack_d38 = (secp256k1_strauss_point_state *)0x1694ef;
  auStack_460._712_8_ = scratch;
  psStack_190 = acc;
  puStack_188 = local_148 + 0x20;
  sStack_180 = sVar10;
  apcStack_170[0] = (code *)out32;
  secp256k1_ecmult_gen(&CTX->ecmult_gen_ctx,&sStack_b30,(secp256k1_scalar *)psVar6);
  r_00 = (secp256k1_strauss_point_state *)auStack_460;
  psStack_d38 = (secp256k1_strauss_point_state *)0x16953c;
  sStack_c30.x.n[0] = (uint64_t)asStack_ab0;
  sStack_c30.x.n[1] = (uint64_t)r_00;
  sStack_c30.x.n[2] = (uint64_t)&sStack_970;
  secp256k1_ecmult_strauss_wnaf
            ((secp256k1_strauss_state *)&sStack_c30,&sStack_bb0,1,&sStack_4e0,
             (secp256k1_scalar *)psVar6,&secp256k1_scalar_zero);
  psStack_d38 = (secp256k1_strauss_point_state *)0x16956f;
  sStack_cb0.x.n[0] = (uint64_t)asStack_ab0;
  sStack_cb0.x.n[1] = (uint64_t)r_00;
  sStack_cb0.x.n[2] = (uint64_t)&sStack_970;
  secp256k1_ecmult_strauss_wnaf
            ((secp256k1_strauss_state *)&sStack_cb0,&sStack_c30,1,&sStack_560,&secp256k1_scalar_zero
             ,(secp256k1_scalar *)psVar6);
  error_callback = (secp256k1_callback *)0xb8;
  elem = (secp256k1_strauss_point_state *)&CTX->error_callback;
  cb = (secp256k1_ecmult_multi_callback *)0x0;
  cbdata = (secp256k1_strauss_point_state *)0x0;
  psStack_d38 = (secp256k1_strauss_point_state *)0x16959e;
  psVar5 = (secp256k1_scalar *)psVar6;
  scratch_01 = scratch_00;
  iVar1 = secp256k1_ecmult_multi_var
                    ((secp256k1_callback *)elem,(secp256k1_scratch *)scratch_00,
                     (secp256k1_gej *)auStack_460,(secp256k1_scalar *)psVar6,
                     (secp256k1_ecmult_multi_callback *)0x0,(void *)0x0,0);
  if (iVar1 == 0) {
    psStack_d38 = (secp256k1_strauss_point_state *)0x16977d;
    test_ecmult_accumulate_cold_8();
LAB_0016977d:
    psStack_d38 = (secp256k1_strauss_point_state *)0x169782;
    test_ecmult_accumulate_cold_7();
LAB_00169782:
    psStack_d38 = (secp256k1_strauss_point_state *)0x169787;
    test_ecmult_accumulate_cold_6();
LAB_00169787:
    psStack_d38 = (secp256k1_strauss_point_state *)0x16978c;
    test_ecmult_accumulate_cold_5();
LAB_0016978c:
    psStack_d38 = (secp256k1_strauss_point_state *)0x169791;
    test_ecmult_accumulate_cold_4();
LAB_00169791:
    psStack_d38 = (secp256k1_strauss_point_state *)0x169796;
    test_ecmult_accumulate_cold_3();
LAB_00169796:
    psStack_d38 = (secp256k1_strauss_point_state *)0x16979b;
    test_ecmult_accumulate_cold_2();
  }
  else {
    error_callback = &CTX->error_callback;
    psVar5 = &secp256k1_scalar_zero;
    cb = test_ecmult_accumulate_cb;
    psStack_d38 = (secp256k1_strauss_point_state *)0x1695d9;
    scratch_01 = scratch_00;
    elem = (secp256k1_strauss_point_state *)error_callback;
    cbdata = psVar6;
    iVar1 = secp256k1_ecmult_multi_var
                      (error_callback,(secp256k1_scratch *)scratch_00,asStack_ab0,
                       &secp256k1_scalar_zero,test_ecmult_accumulate_cb,psVar6,1);
    if (iVar1 == 0) goto LAB_0016977d;
    psStack_d38 = (secp256k1_strauss_point_state *)0x1695f8;
    secp256k1_ecmult_const(&sStack_cb0,&secp256k1_ge_const_g,(secp256k1_scalar *)psVar6);
    psVar6 = (secp256k1_strauss_point_state *)auStack_d08;
    psStack_d38 = (secp256k1_strauss_point_state *)0x16960d;
    secp256k1_ge_set_gej_var((secp256k1_ge *)psVar6,&sStack_b30);
    r_00 = &sStack_970;
    psStack_d38 = (secp256k1_strauss_point_state *)0x169625;
    secp256k1_gej_neg((secp256k1_gej *)r_00,&sStack_bb0);
    psVar5 = (secp256k1_scalar *)0x0;
    psStack_d38 = (secp256k1_strauss_point_state *)0x169635;
    scratch_01 = r_00;
    elem = r_00;
    secp256k1_gej_add_ge_var
              ((secp256k1_gej *)r_00,(secp256k1_gej *)r_00,(secp256k1_ge *)psVar6,
               (secp256k1_fe *)0x0);
    if (sStack_970.wnaf_na_1[0x1e] == 0) goto LAB_00169782;
    psVar6 = &sStack_970;
    psStack_d38 = (secp256k1_strauss_point_state *)0x169658;
    secp256k1_gej_neg((secp256k1_gej *)psVar6,&sStack_c30);
    psVar5 = (secp256k1_scalar *)0x0;
    psStack_d38 = (secp256k1_strauss_point_state *)0x16966a;
    scratch_01 = psVar6;
    elem = psVar6;
    secp256k1_gej_add_ge_var
              ((secp256k1_gej *)psVar6,(secp256k1_gej *)psVar6,(secp256k1_ge *)auStack_d08,
               (secp256k1_fe *)0x0);
    if (sStack_970.wnaf_na_1[0x1e] == 0) goto LAB_00169787;
    psVar6 = &sStack_970;
    psStack_d38 = (secp256k1_strauss_point_state *)0x16968d;
    secp256k1_gej_neg((secp256k1_gej *)psVar6,(secp256k1_gej *)auStack_460);
    psVar5 = (secp256k1_scalar *)0x0;
    psStack_d38 = (secp256k1_strauss_point_state *)0x16969f;
    scratch_01 = psVar6;
    elem = psVar6;
    secp256k1_gej_add_ge_var
              ((secp256k1_gej *)psVar6,(secp256k1_gej *)psVar6,(secp256k1_ge *)auStack_d08,
               (secp256k1_fe *)0x0);
    if (sStack_970.wnaf_na_1[0x1e] == 0) goto LAB_0016978c;
    psVar6 = &sStack_970;
    psStack_d38 = (secp256k1_strauss_point_state *)0x1696c2;
    secp256k1_gej_neg((secp256k1_gej *)psVar6,asStack_ab0);
    psVar5 = (secp256k1_scalar *)0x0;
    psStack_d38 = (secp256k1_strauss_point_state *)0x1696d4;
    scratch_01 = psVar6;
    elem = psVar6;
    secp256k1_gej_add_ge_var
              ((secp256k1_gej *)psVar6,(secp256k1_gej *)psVar6,(secp256k1_ge *)auStack_d08,
               (secp256k1_fe *)0x0);
    if (sStack_970.wnaf_na_1[0x1e] == 0) goto LAB_00169791;
    psVar6 = &sStack_970;
    psStack_d38 = (secp256k1_strauss_point_state *)0x1696f7;
    secp256k1_gej_neg((secp256k1_gej *)psVar6,&sStack_cb0);
    psVar5 = (secp256k1_scalar *)0x0;
    psStack_d38 = (secp256k1_strauss_point_state *)0x169709;
    scratch_01 = psVar6;
    elem = psVar6;
    secp256k1_gej_add_ge_var
              ((secp256k1_gej *)psVar6,(secp256k1_gej *)psVar6,(secp256k1_ge *)auStack_d08,
               (secp256k1_fe *)0x0);
    if (sStack_970.wnaf_na_1[0x1e] == 0) goto LAB_00169796;
    if (auStack_d08._80_4_ != 0) {
      sStack_970.wnaf_na_1[0]._0_1_ = 0;
      sVar7 = 1;
LAB_0016975c:
      psStack_d38 = (secp256k1_strauss_point_state *)0x169766;
      secp256k1_sha256_write(hash,(uchar *)&sStack_970,sVar7);
      return;
    }
    elem = (secp256k1_strauss_point_state *)auStack_d08;
    scratch_01 = &sStack_970;
    psVar6 = (secp256k1_strauss_point_state *)auStack_d10;
    psVar5 = (secp256k1_scalar *)0x0;
    psStack_d38 = (secp256k1_strauss_point_state *)0x169749;
    secp256k1_eckey_pubkey_serialize((secp256k1_ge *)elem,(uchar *)scratch_01,(size_t *)psVar6,0);
    if (auStack_d10 == (undefined1  [8])0x41) {
      sVar7 = 0x41;
      goto LAB_0016975c;
    }
  }
  psStack_d38 = (secp256k1_strauss_point_state *)secp256k1_ecmult_multi_var;
  test_ecmult_accumulate_cold_1();
  r->infinity = 1;
  (r->x).n[0] = 0;
  (r->x).n[1] = 0;
  (r->x).n[2] = 0;
  (r->x).n[3] = 0;
  (r->x).n[4] = 0;
  (r->y).n[0] = 0;
  (r->y).n[1] = 0;
  (r->y).n[2] = 0;
  (r->y).n[3] = 0;
  (r->y).n[4] = 0;
  (r->z).n[0] = 0;
  (r->z).n[1] = 0;
  (r->z).n[2] = 0;
  (r->z).n[3] = 0;
  (r->z).n[4] = 0;
  if ((secp256k1_strauss_point_state *)psVar5 != (secp256k1_strauss_point_state *)0x0 ||
      sStack_d28 != 0) {
    psStack_d58 = error_callback;
    psStack_d50 = &sStack_560;
    psStack_d48 = psVar6;
    psStack_d40 = r_00;
    psStack_d38 = &sStack_970;
    if (sStack_d28 == 0) {
      sStack_1590.aux = asStack_1578;
      sStack_1590.pre_a = asStack_1028;
      sStack_1590.ps = &sStack_1438;
      secp256k1_ecmult_strauss_wnaf(&sStack_1590,r,1,r,&secp256k1_scalar_zero,psVar5);
    }
    else {
      if ((scratch_01 == (secp256k1_strauss_point_state *)0x0) ||
         (sVar7 = secp256k1_pippenger_max_points
                            ((secp256k1_callback *)elem,(secp256k1_scratch *)scratch_01), sVar7 == 0
         )) {
LAB_001699f5:
        secp256k1_ecmult_multi_simple_var(r,psVar5,cb,cbdata,sStack_d28);
        return;
      }
      uVar3 = 5000000;
      if (sVar7 < 5000000) {
        uVar3 = sVar7;
      }
      uVar9 = sStack_d28 - 1;
      uStack_1598 = uVar9 / uVar3 + 1;
      uVar3 = uVar9 / uStack_1598;
      if (uVar3 < 0x57) {
        lVar2 = 0;
        do {
          if (*(char *)((long)((secp256k1_fe *)scratch_01->wnaf_na_1)->n + lVar2) !=
              "scratch"[lVar2]) {
            (*(code *)((secp256k1_fe *)elem->wnaf_na_1)->n[0])
                      ("invalid scratch space",((secp256k1_fe *)elem->wnaf_na_1)->n[1]);
            goto LAB_001699f5;
          }
          lVar2 = lVar2 + 1;
        } while (lVar2 != 8);
        uVar8 = ((secp256k1_fe *)scratch_01->wnaf_na_1)->n[3] -
                ((secp256k1_fe *)scratch_01->wnaf_na_1)->n[2];
        uVar3 = 0;
        if (0x4a < uVar8) {
          uVar3 = uVar8 - 0x4b;
        }
        if (uVar3 < 0x8b0) goto LAB_001699f5;
        uVar3 = uVar3 / 0x8b0;
        if (4999999 < uVar3) {
          uVar3 = 5000000;
        }
        uStack_1598 = uVar9 / uVar3 + 1;
        uVar3 = uVar9 / uStack_1598;
        pcVar4 = secp256k1_ecmult_strauss_batch;
      }
      else {
        pcVar4 = secp256k1_ecmult_pippenger_batch;
      }
      uVar3 = uVar3 + 1;
      lVar2 = 0;
      uVar9 = 0;
      do {
        uVar8 = uVar3;
        if (sStack_d28 < uVar3) {
          uVar8 = sStack_d28;
        }
        psVar6 = (secp256k1_strauss_point_state *)0x0;
        if (uVar9 == 0) {
          psVar6 = (secp256k1_strauss_point_state *)psVar5;
        }
        iVar1 = (*pcVar4)(elem,scratch_01,&sStack_1438,psVar6,cb,cbdata,uVar8,lVar2);
        if (iVar1 == 0) {
          return;
        }
        secp256k1_gej_add_var(r,r,(secp256k1_gej *)&sStack_1438,(secp256k1_fe *)0x0);
        sStack_d28 = sStack_d28 - uVar8;
        uVar9 = uVar9 + 1;
        lVar2 = lVar2 + uVar3;
      } while (uStack_1598 != uVar9);
    }
  }
  return;
}

Assistant:

static void test_ecmult_constants_sha(uint32_t prefix, size_t iter, const unsigned char* expected32) {
    /* Using test_ecmult_accumulate, test ecmult for:
     * - Key 0
     * - Key 1
     * - Key -1
     * - For i in range(iter):
     *   - Key SHA256(LE32(prefix) || LE16(i))
     */
    secp256k1_scalar x;
    secp256k1_sha256 acc;
    unsigned char b32[32];
    unsigned char inp[6];
    size_t i;
    secp256k1_scratch_space *scratch = secp256k1_scratch_space_create(CTX, 65536);

    inp[0] = prefix & 0xFF;
    inp[1] = (prefix >> 8) & 0xFF;
    inp[2] = (prefix >> 16) & 0xFF;
    inp[3] = (prefix >> 24) & 0xFF;
    secp256k1_sha256_initialize(&acc);
    secp256k1_scalar_set_int(&x, 0);
    test_ecmult_accumulate(&acc, &x, scratch);
    secp256k1_scalar_set_int(&x, 1);
    test_ecmult_accumulate(&acc, &x, scratch);
    secp256k1_scalar_negate(&x, &x);
    test_ecmult_accumulate(&acc, &x, scratch);

    for (i = 0; i < iter; ++i) {
        secp256k1_sha256 gen;
        inp[4] = i & 0xff;
        inp[5] = (i >> 8) & 0xff;
        secp256k1_sha256_initialize(&gen);
        secp256k1_sha256_write(&gen, inp, sizeof(inp));
        secp256k1_sha256_finalize(&gen, b32);
        secp256k1_scalar_set_b32(&x, b32, NULL);
        test_ecmult_accumulate(&acc, &x, scratch);
    }
    secp256k1_sha256_finalize(&acc, b32);
    CHECK(secp256k1_memcmp_var(b32, expected32, 32) == 0);

    secp256k1_scratch_space_destroy(CTX, scratch);
}